

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void J400ToARGBRow_C(uint8_t *src_y,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  uint8_t y;
  int x;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_y_local;
  
  dst_argb_local = dst_argb;
  src_y_local = src_y;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = *src_y_local;
    *dst_argb_local = uVar1;
    dst_argb_local[1] = uVar1;
    dst_argb_local[2] = uVar1;
    dst_argb_local[3] = 0xff;
    dst_argb_local = dst_argb_local + 4;
    src_y_local = src_y_local + 1;
  }
  return;
}

Assistant:

void J400ToARGBRow_C(const uint8_t* src_y, uint8_t* dst_argb, int width) {
  // Copy a Y to RGB.
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t y = src_y[0];
    dst_argb[2] = dst_argb[1] = dst_argb[0] = y;
    dst_argb[3] = 255u;
    dst_argb += 4;
    ++src_y;
  }
}